

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::ConcatenationExpression::evalImpl
          (ConstantValue *__return_storage_ptr__,ConcatenationExpression *this,EvalContext *context)

{
  _Uninitialized<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_true>
  _Var1;
  size_t sVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  Type *this_00;
  Type *pTVar7;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:232:13),_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
  pCVar8;
  variant_alternative_t<6UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  Expression *ctx;
  ConstantRange CVar10;
  Diagnostic *pDVar11;
  int iVar12;
  pointer ppEVar13;
  int iVar14;
  Expression *pEVar15;
  long lVar16;
  span<const_slang::SVInt,_18446744073709551615UL> operands;
  bool __ret;
  ConstantValue cv;
  vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> result_1;
  SmallVector<slang::SVInt,_4UL> values;
  CVIterator<false> __end6;
  CVIterator<false> __begin6;
  char local_179;
  Expression *local_178;
  EvalContext *local_170;
  ConcatenationExpression *local_168;
  undefined1 local_160 [32];
  __index_type local_140;
  pointer local_138;
  pointer local_130;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_128;
  undefined1 local_f8 [32];
  _Elt_pointer local_d8;
  _Map_pointer ppCStack_d0;
  _Elt_pointer local_c8;
  _Elt_pointer pCStack_c0;
  _Elt_pointer local_b8;
  _Map_pointer ppCStack_b0;
  uint32_t local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  _Variadic_union<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
  local_80;
  char local_60;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
  local_58;
  
  local_178 = (Expression *)__return_storage_ptr__;
  local_170 = context;
  bVar4 = Type::isUnpackedArray((this->super_Expression).type.ptr);
  pTVar7 = (this->super_Expression).type.ptr;
  if (!bVar4) {
    if (pTVar7->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar7);
    }
    if ((pTVar7->canonical->super_Symbol).kind != StringType) {
      local_f8._0_8_ = local_f8 + 0x18;
      local_f8._8_8_ = 0;
      local_f8._16_8_ = (_Elt_pointer)0x4;
      sVar2 = (this->operands_)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        ppEVar13 = (this->operands_)._M_ptr;
        lVar16 = 0;
        do {
          pEVar15 = *(Expression **)((long)ppEVar13 + lVar16);
          ctx = pEVar15;
          Expression::eval((ConstantValue *)local_160,pEVar15,local_170);
          if (local_140 == '\0') {
            *(undefined1 *)&(local_178->sourceRange).startLoc = 0;
            iVar14 = 1;
          }
          else {
            pTVar7 = (pEVar15->type).ptr;
            if (pTVar7->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar7);
            }
            iVar14 = 5;
            if ((pTVar7->canonical->super_Symbol).kind != VoidType) {
              ctx = (Expression *)
                    std::
                    get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                              ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                *)local_160);
              iVar14 = 0;
              SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt_const&>
                        ((SmallVectorBase<slang::SVInt> *)local_f8,(SVInt *)ctx);
            }
          }
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_160);
          if ((iVar14 != 5) && (iVar14 != 0)) goto LAB_0042dc75;
          lVar16 = lVar16 + 8;
        } while (sVar2 << 3 != lVar16);
      }
      operands._M_extent._M_extent_value = local_f8._0_8_;
      operands._M_ptr = (pointer)local_160;
      SVInt::concat(operands);
      uVar3 = local_160._0_8_;
      *(long *)local_178 = 0;
      *(undefined4 *)&(local_178->type).ptr = local_160._8_4_;
      *(undefined1 *)((long)&(local_178->type).ptr + 4) = local_160[0xc];
      *(undefined1 *)((long)&(local_178->type).ptr + 5) = local_160[0xd];
      if (0x40 < (uint)local_160._8_4_ || (local_160._8_8_ & 0x10000000000) != 0) {
        local_160._0_8_ =
             (__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
              )0x0;
      }
      *(undefined8 *)local_178 = uVar3;
      *(undefined1 *)&(local_178->sourceRange).startLoc = 1;
      ctx = local_178;
      if ((0x40 < (uint)local_160._8_4_ || (local_160._8_8_ & 0x10000000000) != 0) &&
         ((__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
           )local_160._0_8_ !=
          (__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
           )0x0)) {
        operator_delete__((void *)local_160._0_8_);
      }
LAB_0042dc75:
      SmallVectorBase<slang::SVInt>::cleanup
                ((SmallVectorBase<slang::SVInt> *)local_f8,(EVP_PKEY_CTX *)ctx);
      return (ConstantValue *)local_178;
    }
    _Var1._M_storage._M_current =
         (__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
          )((long)local_160 + 0x10);
    local_160._8_8_ = (Type *)0x0;
    local_160[0x10] = '\0';
    sVar2 = (this->operands_)._M_extent._M_extent_value;
    local_160._0_8_ = _Var1._M_storage._M_current;
    if (sVar2 != 0) {
      ppEVar13 = (this->operands_)._M_ptr;
      lVar16 = 0;
      do {
        pEVar15 = *(Expression **)((long)ppEVar13 + lVar16);
        Expression::eval((ConstantValue *)local_f8,pEVar15,local_170);
        if ((__index_type)local_d8 == '\0') {
          *(undefined1 *)&(local_178->sourceRange).startLoc = 0;
          iVar14 = 1;
        }
        else {
          pTVar7 = (pEVar15->type).ptr;
          if (pTVar7->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar7);
          }
          iVar14 = 3;
          if ((pTVar7->canonical->super_Symbol).kind != VoidType) {
            pvVar9 = std::
                     get<6ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                               ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)local_f8);
            iVar14 = 0;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160
                      ,(pvVar9->_M_dataplus)._M_p,pvVar9->_M_string_length);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_f8);
        if ((iVar14 != 3) && (iVar14 != 0)) goto LAB_0042ddeb;
        lVar16 = lVar16 + 8;
      } while (sVar2 << 3 != lVar16);
    }
    *(ConstantValue ***)local_178 = &local_178->constant;
    if ((__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
         )local_160._0_8_ == _Var1._M_storage._M_current) {
      local_178->constant = (ConstantValue *)CONCAT71(local_160._17_7_,local_160[0x10]);
      local_178->syntax = (ExpressionSyntax *)local_160._24_8_;
    }
    else {
      *(undefined8 *)local_178 = local_160._0_8_;
      local_178->constant = (ConstantValue *)CONCAT71(local_160._17_7_,local_160[0x10]);
    }
    (local_178->type).ptr = (Type *)local_160._8_8_;
    local_160._8_8_ = (Type *)0x0;
    local_160[0x10] = '\0';
    *(undefined1 *)&(local_178->sourceRange).startLoc = 6;
    local_160._0_8_ = _Var1._M_storage._M_current;
LAB_0042ddeb:
    if ((__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
         )local_160._0_8_ == _Var1._M_storage._M_current) {
      return (ConstantValue *)local_178;
    }
    operator_delete((void *)local_160._0_8_,CONCAT71(local_160._17_7_,local_160[0x10]) + 1);
    return (ConstantValue *)local_178;
  }
  this_00 = Type::getArrayElementType(pTVar7);
  pTVar7 = (this->super_Expression).type.ptr;
  if (pTVar7->canonical == (Type *)0x0) {
    Type::resolveCanonical(pTVar7);
  }
  if ((pTVar7->canonical->super_Symbol).kind == QueueType) {
    local_b8 = (_Elt_pointer)0x0;
    ppCStack_b0 = (_Map_pointer)0x0;
    local_c8 = (_Elt_pointer)0x0;
    pCStack_c0 = (_Elt_pointer)0x0;
    local_d8 = (_Elt_pointer)0x0;
    ppCStack_d0 = (_Map_pointer)0x0;
    local_f8._16_8_ = (_Elt_pointer)0x0;
    local_f8._24_8_ = (_Elt_pointer)0x0;
    local_f8._0_8_ = (_Map_pointer)0x0;
    local_f8._8_8_ = 0;
    std::_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::_M_initialize_map
              ((_Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_f8,
               0);
    local_a8 = 0;
    pTVar7 = (this->super_Expression).type.ptr;
    if (pTVar7->canonical == (Type *)0x0) {
      Type::resolveCanonical(pTVar7);
    }
    local_a8 = (uint32_t)pTVar7->canonical[1].super_Symbol.name._M_len;
    sVar2 = (this->operands_)._M_extent._M_extent_value;
    bVar4 = sVar2 == 0;
    if (!bVar4) {
      ppEVar13 = (this->operands_)._M_ptr;
      local_138 = ppEVar13 + sVar2;
      bVar4 = false;
      do {
        pEVar15 = *ppEVar13;
        local_130 = ppEVar13;
        Expression::eval((ConstantValue *)local_160,pEVar15,local_170);
        if (local_140 == '\0') {
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)local_160);
          break;
        }
        bVar4 = Type::isEquivalent(this_00,(pEVar15->type).ptr);
        if (bVar4) {
          std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>
                    ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_f8,
                     (ConstantValue *)local_160);
        }
        else {
          pTVar7 = Type::getArrayElementType((pEVar15->type).ptr);
          std::
          visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    (&local_58,(anon_class_1_0_00000001 *)&local_80._M_first,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)local_160);
          std::
          visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                      *)&local_80._M_first,(anon_class_1_0_00000001 *)&local_128,
                     (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      *)local_160);
          while( true ) {
            local_179 = '\x01';
            local_128._0_8_ = &local_179;
            local_128._8_8_ = &local_58;
            (*std::__detail::__variant::
              __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
              ::_S_vtable._M_arr[(long)local_60 + 1]._M_data)
                      ((anon_class_16_2_9763bfdf *)&local_128,
                       (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                        *)&local_80);
            if (local_179 == '\x01') break;
            pCVar8 = std::
                     visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                               ((anon_class_1_0_00000001 *)&local_128,&local_58.current);
            local_98 = 0;
            uStack_90 = 0;
            ConversionExpression::convert
                      ((ConstantValue *)&local_128,local_170,pTVar7,this_00,pEVar15->sourceRange,
                       pCVar8,Implicit,(Expression *)0x0,(SourceRange)ZEXT816(0));
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
            emplace_back<slang::ConstantValue>
                      ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                       local_f8,(ConstantValue *)&local_128);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&local_128);
            std::
            visit<slang::CVIterator<false>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>&>
                      ((anon_class_1_0_00000001 *)&local_128,&local_58.current);
          }
        }
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_160);
        ppEVar13 = local_130 + 1;
        bVar4 = ppEVar13 == local_138;
      } while (!bVar4);
    }
    if (bVar4) {
      SVQueue::resizeToBound((SVQueue *)local_f8);
      pEVar15 = local_178;
      CopyPtr<slang::SVQueue>::CopyPtr<slang::SVQueue>
                ((CopyPtr<slang::SVQueue> *)local_160,(SVQueue *)local_f8);
      uVar3 = local_160._0_8_;
      local_160._0_8_ =
           (__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>
            )0x0;
      *(undefined8 *)pEVar15 = uVar3;
      *(undefined1 *)&(pEVar15->sourceRange).startLoc = 8;
      CopyPtr<slang::SVQueue>::~CopyPtr((CopyPtr<slang::SVQueue> *)local_160);
    }
    else {
      *(undefined1 *)&(local_178->sourceRange).startLoc = 0;
      pEVar15 = local_178;
    }
    std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
              ((deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)local_f8);
    return (ConstantValue *)pEVar15;
  }
  local_128._0_8_ = 0;
  local_128._8_8_ = (Type *)0x0;
  local_128._16_8_ = (ConstantValue *)0x0;
  sVar2 = (this->operands_)._M_extent._M_extent_value;
  bVar4 = sVar2 == 0;
  local_168 = this;
  if (!bVar4) {
    ppEVar13 = (this->operands_)._M_ptr;
    local_138 = ppEVar13 + sVar2;
    bVar4 = false;
    do {
      pEVar15 = *ppEVar13;
      local_130 = ppEVar13;
      Expression::eval((ConstantValue *)local_f8,pEVar15,local_170);
      if ((__index_type)local_d8 == '\0') {
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)local_f8);
        break;
      }
      bVar4 = Type::isEquivalent(this_00,(pEVar15->type).ptr);
      if (bVar4) {
        std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
        emplace_back<slang::ConstantValue>
                  ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_128
                   ,(ConstantValue *)local_f8);
      }
      else {
        pTVar7 = Type::getArrayElementType((pEVar15->type).ptr);
        std::
        visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  ((__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                    *)local_160,(anon_class_1_0_00000001 *)&local_58,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)local_f8);
        std::
        visit<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:290:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                  (&local_58,(anon_class_1_0_00000001 *)&local_80._M_first,
                   (variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    *)local_f8);
        while( true ) {
          local_179 = '\x01';
          local_80._M_first._M_storage._M_current =
               (_Uninitialized<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_true>
                )&local_179;
          local_80._8_8_ =
               (__visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_numeric_ConstantValue_h:270:9),_std::variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>_&>
                *)local_160;
          (*std::__detail::__variant::
            __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>_&>
            ::_S_vtable._M_arr
            [(long)(char)local_58.current.
                         super__Variant_base<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         .
                         super__Move_assign_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         .
                         super__Copy_assign_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         .
                         super__Move_ctor_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         .
                         super__Copy_ctor_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         .
                         super__Variant_storage_alias<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                         ._M_index + 1]._M_data)
                    ((anon_class_16_2_9763bfdf *)&local_80,&local_58.current);
          if (local_179 == '\x01') break;
          pCVar8 = std::
                   visit<slang::CVIterator<false>::dereference()const::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>const&>
                             ((anon_class_1_0_00000001 *)&local_80._M_first,
                              (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                               *)local_160);
          local_98 = 0;
          uStack_90 = 0;
          ConversionExpression::convert
                    ((ConstantValue *)&local_80._M_first,local_170,pTVar7,this_00,
                     pEVar15->sourceRange,pCVar8,Implicit,(Expression *)0x0,(SourceRange)ZEXT816(0))
          ;
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::
          emplace_back<slang::ConstantValue>
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     &local_128,(ConstantValue *)&local_80._M_first);
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)&local_80._M_first);
          std::
          visit<slang::CVIterator<false>::increment()::_lambda(auto:1&&)_1_,std::variant<__gnu_cxx::__normal_iterator<slang::ConstantValue*,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>>,std::_Rb_tree_iterator<std::pair<slang::ConstantValue_const,slang::ConstantValue>>,std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>>&>
                    ((anon_class_1_0_00000001 *)&local_80._M_first,
                     (variant<__gnu_cxx::__normal_iterator<slang::ConstantValue_*,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>_>,_std::_Rb_tree_iterator<std::pair<const_slang::ConstantValue,_slang::ConstantValue>_>,_std::_Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*>_>
                      *)local_160);
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)local_f8);
      ppEVar13 = local_130 + 1;
      bVar4 = ppEVar13 == local_138;
    } while (!bVar4);
  }
  if (bVar4) {
    bVar4 = Type::hasFixedRange((local_168->super_Expression).type.ptr);
    pEVar15 = local_178;
    if (bVar4) {
      CVar10 = Type::getFixedRange((local_168->super_Expression).type.ptr);
      iVar6 = CVar10.left;
      iVar12 = CVar10.right;
      iVar14 = iVar6 - iVar12;
      if (iVar6 - iVar12 == 0 || iVar6 < iVar12) {
        iVar14 = -(iVar6 - iVar12);
      }
      if (((long)(local_128._8_8_ - local_128._0_8_) >> 3) * -0x3333333333333333 -
          (ulong)(iVar14 + 1) != 0) {
        pDVar11 = EvalContext::addDiag
                            (local_170,(DiagCode)0xa70007,(local_168->super_Expression).sourceRange)
        ;
        pDVar11 = ast::operator<<(pDVar11,(local_168->super_Expression).type.ptr);
        CVar10 = Type::getFixedRange((local_168->super_Expression).type.ptr);
        iVar6 = CVar10.left;
        iVar12 = CVar10.right;
        iVar14 = iVar6 - iVar12;
        if (iVar6 - iVar12 == 0 || iVar6 < iVar12) {
          iVar14 = -(iVar6 - iVar12);
        }
        local_f8._0_8_ = ZEXT48(iVar14 + 1);
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)local_f8);
        local_f8._0_8_ = ((long)(local_128._8_8_ - local_128._0_8_) >> 3) * -0x3333333333333333;
        std::
        vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
        ::emplace_back<unsigned_long>(&pDVar11->args,(unsigned_long *)local_f8);
        uVar5 = 0;
        goto LAB_0042dd3e;
      }
    }
    *(undefined8 *)pEVar15 = local_128._0_8_;
    (pEVar15->type).ptr = (Type *)local_128._8_8_;
    pEVar15->constant = (ConstantValue *)local_128._16_8_;
    local_128._0_8_ = 0;
    local_128._8_8_ = (Type *)0x0;
    local_128._16_8_ = (ConstantValue *)0x0;
    uVar5 = 5;
  }
  else {
    uVar5 = 0;
    pEVar15 = local_178;
  }
LAB_0042dd3e:
  *(undefined1 *)&(pEVar15->sourceRange).startLoc = uVar5;
  std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
            ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)&local_128);
  return (ConstantValue *)pEVar15;
}

Assistant:

ConstantValue ConcatenationExpression::evalImpl(EvalContext& context) const {
    if (type->isUnpackedArray()) {
        auto& elemType = *type->getArrayElementType();
        auto build = [&](auto&& result) {
            for (auto op : operands()) {
                ConstantValue cv = op->eval(context);
                if (!cv)
                    return false;

                // Check if we can take this element as-is or if we need to
                // unwrap it into constituents.
                if (elemType.isEquivalent(*op->type))
                    result.emplace_back(std::move(cv));
                else {
                    SLANG_ASSERT(cv.isContainer());
                    const Type& from = *op->type->getArrayElementType();
                    for (auto& elem : cv) {
                        result.emplace_back(ConversionExpression::convert(
                            context, from, elemType, op->sourceRange, std::move(elem),
                            ConversionKind::Implicit));
                    }
                }
            }
            return true;
        };

        if (type->isQueue()) {
            SVQueue result;
            result.maxBound = type->getCanonicalType().as<QueueType>().maxBound;
            if (!build(result))
                return nullptr;

            result.resizeToBound();
            return result;
        }
        else {
            std::vector<ConstantValue> result;
            if (!build(result))
                return nullptr;

            // If we have a fixed size target, check that they match in size.
            if (type->hasFixedRange() && type->getFixedRange().width() != result.size()) {
                context.addDiag(diag::UnpackedConcatSize, sourceRange)
                    << *type << type->getFixedRange().width() << result.size();
                return nullptr;
            }

            return result;
        }
    }

    if (type->isString()) {
        std::string result;
        for (auto operand : operands()) {
            ConstantValue v = operand->eval(context);
            if (!v)
                return nullptr;

            // Skip zero-width replication operands.
            if (operand->type->isVoid())
                continue;

            result.append(v.str());
        }

        return result;
    }

    SmallVector<SVInt, 4> values;
    for (auto operand : operands()) {
        ConstantValue v = operand->eval(context);
        if (!v)
            return nullptr;

        // Skip zero-width replication operands.
        if (operand->type->isVoid())
            continue;

        values.push_back(v.integer());
    }

    return SVInt::concat(values);
}